

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O2

string * __thiscall
lsp::ArxmlStorage::getUriFromFileIndex_abi_cxx11_
          (string *__return_storage_ptr__,ArxmlStorage *this,uint32_t fileIndex)

{
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,
             (string *)
             ((this->URIs_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + fileIndex));
  return __return_storage_ptr__;
}

Assistant:

std::string lsp::ArxmlStorage::getUriFromFileIndex(uint32_t fileIndex)
{
    return URIs_[fileIndex];
}